

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_hashtable.cpp
# Opt level: O2

idx_t __thiscall
duckdb::GroupedAggregateHashTable::AddChunk
          (GroupedAggregateHashTable *this,DataChunk *groups,DataChunk *payload,
          unsafe_vector<idx_t> *filter)

{
  Vector *result_00;
  idx_t iVar1;
  optional_idx result;
  optional_idx local_30;
  
  this->sink_count = this->sink_count + groups->count;
  local_30 = TryAddCompressedGroups(this,groups,payload,filter);
  if (local_30.index != 0xffffffffffffffff) {
    iVar1 = optional_idx::GetIndex(&local_30);
    return iVar1;
  }
  result_00 = &(this->state).hashes;
  DataChunk::Hash(groups,result_00);
  iVar1 = AddChunk(this,groups,result_00,payload,filter);
  return iVar1;
}

Assistant:

idx_t GroupedAggregateHashTable::AddChunk(DataChunk &groups, DataChunk &payload, const unsafe_vector<idx_t> &filter) {
	sink_count += groups.size();

	// check if we can use an optimized path that utilizes compressed vectors
	auto result = TryAddCompressedGroups(groups, payload, filter);
	if (result.IsValid()) {
		return result.GetIndex();
	}
	// otherwise append the raw values
	groups.Hash(state.hashes);

	return AddChunk(groups, state.hashes, payload, filter);
}